

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void EmitDestructuredObject
               (ParseNode *lhs,RegSlot rhsLocationOrig,ByteCodeGenerator *byteCodeGenerator,
               FuncInfo *funcInfo)

{
  code *pcVar1;
  anon_class_56_7_8c365b3e handler;
  bool bVar2;
  undefined4 *puVar3;
  ByteCodeWriter *pBVar4;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar5;
  PropertyIdArray *this;
  undefined4 local_a4;
  code *pcStack_a0;
  uint32 index;
  undefined8 local_98;
  TrackAllocData local_90;
  PropertyIdArray *local_68;
  PropertyIdArray *propIds;
  uint32 local_58;
  uint auxSize;
  uint extraAlloc;
  RegSlot computedPropIdArrLocation;
  RegSlot propIdArrLocation;
  RegSlot rhsLocation;
  ByteCodeLabel skipThrow;
  bool hasComputedProps;
  uint uStack_3c;
  bool hasRest;
  uint32 computedCount;
  uint32 staticCount;
  ParseNodePtr pnode1;
  ParseNodeObjLit *pnodeObjLit;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  ParseNode *pPStack_10;
  RegSlot rhsLocationOrig_local;
  ParseNode *lhs_local;
  
  pnodeObjLit = (ParseNodeObjLit *)funcInfo;
  funcInfo_local = (FuncInfo *)byteCodeGenerator;
  byteCodeGenerator_local._4_4_ = rhsLocationOrig;
  pPStack_10 = lhs;
  if (lhs->nop != knopObjectPattern) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1bdf,"(lhs->nop == knopObjectPattern)","lhs->nop == knopObjectPattern");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pnode1 = (ParseNodePtr)ParseNode::AsParseNodeObjLit(pPStack_10);
  _computedCount = (((ParseNodeObjLit *)pnode1)->super_ParseNodeUni).pnode1;
  uStack_3c = ((ParseNodeObjLit *)pnode1)->staticCount;
  skipThrow = ((ParseNodeObjLit *)pnode1)->computedCount;
  rhsLocation._3_1_ = ((ParseNodeObjLit *)pnode1)->hasRest & 1;
  rhsLocation._2_1_ = 0;
  ByteCodeGenerator::StartStatement((ByteCodeGenerator *)funcInfo_local,pPStack_10);
  pBVar4 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
  propIdArrLocation = Js::ByteCodeWriter::DefineLabel(pBVar4);
  computedPropIdArrLocation = FuncInfo::AcquireTmpRegister((FuncInfo *)pnodeObjLit);
  pBVar4 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
  Js::ByteCodeWriter::Reg2(pBVar4,Ld_A,computedPropIdArrLocation,byteCodeGenerator_local._4_4_);
  pBVar4 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
  Js::ByteCodeWriter::BrReg2
            (pBVar4,BrNeq_A,propIdArrLocation,computedPropIdArrLocation,
             *(RegSlot *)&pnodeObjLit[2].field_0x24);
  pBVar4 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
  Js::ByteCodeWriter::W1(pBVar4,RuntimeTypeError,0x1610);
  pBVar4 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
  Js::ByteCodeWriter::MarkLabel(pBVar4,propIdArrLocation);
  if (_computedCount != (ParseNodePtr)0x0) {
    extraAlloc = 0xffffffff;
    auxSize = 0xffffffff;
    if ((rhsLocation._3_1_ & 1) != 0) {
      local_58 = UInt32Math::Mul(uStack_3c,4);
      propIds._4_4_ = UInt32Math::Add(8,local_58);
      pAVar5 = &ByteCodeGenerator::GetAllocator((ByteCodeGenerator *)funcInfo_local)->
                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_90,(type_info *)&Js::PropertyIdArray::typeinfo,(ulong)local_58,
                 0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                 ,0x1bf8);
      pAVar5 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo(pAVar5,&local_90);
      pcStack_a0 = Memory::ArenaAllocator::Alloc;
      local_98 = 0;
      this = (PropertyIdArray *)new<Memory::ArenaAllocator>(8,(ArenaAllocator *)pAVar5,0x3f67b0,0);
      Js::PropertyIdArray::PropertyIdArray(this,uStack_3c,'\0',false,false,false);
      local_68 = this;
      if (((_computedCount->nop != knopList) && (_computedCount->nop != knopObjectPatternMember)) &&
         (_computedCount->nop != knopEllipsis)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x1bfa,
                           "(pnode1->nop == knopList || pnode1->nop == knopObjectPatternMember || pnode1->nop == knopEllipsis)"
                           ,
                           "pnode1->nop == knopList || pnode1->nop == knopObjectPatternMember || pnode1->nop == knopEllipsis"
                          );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      EmitObjectPropertyIdsToArray
                ((ByteCodeGenerator *)funcInfo_local,(PropertyId *)(local_68 + 1),_computedCount,
                 uStack_3c,(bool *)((long)&rhsLocation + 2));
      extraAlloc = FuncInfo::AcquireTmpRegister((FuncInfo *)pnodeObjLit);
      pBVar4 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
      Js::ByteCodeWriter::Auxiliary(pBVar4,LdPropIds,extraAlloc,local_68,propIds._4_4_,uStack_3c);
      if ((rhsLocation._2_1_ & 1) == 0) {
        auxSize = extraAlloc;
      }
      else {
        auxSize = FuncInfo::AcquireTmpRegister((FuncInfo *)pnodeObjLit);
        pBVar4 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
        Js::ByteCodeWriter::Reg1Unsigned1(pBVar4,NewPropIdArrForCompProps,auxSize,skipThrow);
      }
    }
    local_a4 = 0;
    handler.propIdArrLocation = &extraAlloc;
    handler.rhsLocation = &computedPropIdArrLocation;
    handler.computedPropIdArrLocation = &auxSize;
    handler.index = &local_a4;
    handler.hasRest = (bool *)((long)&rhsLocation + 3);
    handler.byteCodeGenerator = (ByteCodeGenerator **)&funcInfo_local;
    handler.funcInfo = (FuncInfo **)&pnodeObjLit;
    Parser::
    ForEachItemInList<EmitDestructuredObject(ParseNode*,unsigned_int,ByteCodeGenerator*,FuncInfo*)::__0>
              (_computedCount,handler);
    if ((rhsLocation._3_1_ & 1) != 0) {
      if ((rhsLocation._2_1_ & 1) != 0) {
        FuncInfo::ReleaseTmpRegister((FuncInfo *)pnodeObjLit,auxSize);
      }
      FuncInfo::ReleaseTmpRegister((FuncInfo *)pnodeObjLit,extraAlloc);
    }
  }
  FuncInfo::ReleaseTmpRegister((FuncInfo *)pnodeObjLit,computedPropIdArrLocation);
  ByteCodeGenerator::EndStatement((ByteCodeGenerator *)funcInfo_local,pPStack_10);
  return;
}

Assistant:

void EmitDestructuredObject(ParseNode *lhs,
    Js::RegSlot rhsLocationOrig,
    ByteCodeGenerator *byteCodeGenerator,
    FuncInfo *funcInfo)
{
    Assert(lhs->nop == knopObjectPattern);
    ParseNodeObjLit *pnodeObjLit = lhs->AsParseNodeObjLit();
    ParseNodePtr pnode1 = pnodeObjLit->pnode1;
    uint32 staticCount = pnodeObjLit->staticCount;
    uint32 computedCount = pnodeObjLit->computedCount;
    bool hasRest = pnodeObjLit->hasRest;
    bool hasComputedProps = false;

    byteCodeGenerator->StartStatement(lhs);

    Js::ByteCodeLabel skipThrow = byteCodeGenerator->Writer()->DefineLabel();
    Js::RegSlot rhsLocation = funcInfo->AcquireTmpRegister();
    byteCodeGenerator->Writer()->Reg2(Js::OpCode::Ld_A, rhsLocation, rhsLocationOrig);
    byteCodeGenerator->Writer()->BrReg2(Js::OpCode::BrNeq_A, skipThrow, rhsLocation, funcInfo->undefinedConstantRegister);
    byteCodeGenerator->Writer()->W1(Js::OpCode::RuntimeTypeError, SCODE_CODE(JSERR_ObjectCoercible));
    byteCodeGenerator->Writer()->MarkLabel(skipThrow);

    if (pnode1 != nullptr)
    {
        Js::RegSlot propIdArrLocation = Js::Constants::NoRegister;
        Js::RegSlot computedPropIdArrLocation = Js::Constants::NoRegister;
        if (hasRest)
        {
            uint extraAlloc = UInt32Math::Mul(staticCount, sizeof(Js::PropertyId));
            uint auxSize = UInt32Math::Add(sizeof(Js::PropertyIdArray), extraAlloc);
            Js::PropertyIdArray *propIds = AnewPlus(byteCodeGenerator->GetAllocator(), extraAlloc, Js::PropertyIdArray, staticCount, 0);

            Assert(pnode1->nop == knopList || pnode1->nop == knopObjectPatternMember || pnode1->nop == knopEllipsis);

            EmitObjectPropertyIdsToArray(byteCodeGenerator, propIds->elements, pnode1, staticCount, &hasComputedProps);

            // Load static PropertyIdArray here
            propIdArrLocation = funcInfo->AcquireTmpRegister();
            byteCodeGenerator->Writer()->Auxiliary(Js::OpCode::LdPropIds, propIdArrLocation, propIds, auxSize, staticCount);

            if (hasComputedProps)
            {
                computedPropIdArrLocation = funcInfo->AcquireTmpRegister();
                byteCodeGenerator->Writer()->Reg1Unsigned1(Js::OpCode::NewPropIdArrForCompProps, computedPropIdArrLocation, computedCount);
            }
            else
            {
                computedPropIdArrLocation = propIdArrLocation;
            }
        }

        uint32 index = 0;
        Parser::ForEachItemInList(pnode1, [&](ParseNodePtr memberNode) {
            EmitDestructuredObjectMember(memberNode, rhsLocation, propIdArrLocation, computedPropIdArrLocation, 
                &index, hasRest, byteCodeGenerator, funcInfo);
        });

        if (hasRest)
        {
            if (hasComputedProps)
            {
                funcInfo->ReleaseTmpRegister(computedPropIdArrLocation);
            }
            funcInfo->ReleaseTmpRegister(propIdArrLocation);
        }
    }

    funcInfo->ReleaseTmpRegister(rhsLocation);
    
    byteCodeGenerator->EndStatement(lhs);
}